

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlUnknown::Print(TiXmlUnknown *this,FILE *cfile,int depth)

{
  char *pcVar1;
  int local_20;
  int i;
  int depth_local;
  FILE *cfile_local;
  TiXmlUnknown *this_local;
  
  for (local_20 = 0; local_20 < depth; local_20 = local_20 + 1) {
    fprintf((FILE *)cfile,"    ");
  }
  pcVar1 = TiXmlString::c_str(&(this->super_TiXmlNode).value);
  fprintf((FILE *)cfile,"<%s>",pcVar1);
  return;
}

Assistant:

void TiXmlUnknown::Print( FILE* cfile, int depth ) const
{
	for ( int i=0; i<depth; i++ )
		fprintf( cfile, "    " );
	fprintf( cfile, "<%s>", value.c_str() );
}